

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu.cpp
# Opt level: O2

int __thiscall ncnn::ELU::forward_inplace(ELU *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  int iVar2;
  int i;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  int c;
  float fVar6;
  Mat local_68;
  
  uVar4 = bottom_top_blob->h * bottom_top_blob->w;
  uVar3 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar3;
  }
  iVar2 = bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    iVar2 = 0;
  }
  while (c = (int)uVar3, c != iVar2) {
    Mat::channel(&local_68,bottom_top_blob,c);
    pvVar1 = local_68.data;
    Mat::~Mat(&local_68);
    for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      fVar6 = *(float *)((long)pvVar1 + uVar3 * 4);
      if (fVar6 < 0.0) {
        fVar6 = expf(fVar6);
        *(float *)((long)pvVar1 + uVar3 * 4) = (fVar6 + -1.0) * this->alpha;
      }
    }
    uVar3 = (ulong)(c + 1);
  }
  return 0;
}

Assistant:

int ELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            if (ptr[i] < 0.f)
                ptr[i] = alpha * (exp(ptr[i]) - 1.f);
        }
    }

    return 0;
}